

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils-inl.hpp
# Opt level: O2

void CoreMLConverter::errorInCaffeProto
               (string *errorDescription,string *layerName,string *layerType)

{
  ostream *poVar1;
  runtime_error *this;
  string asStack_1c8 [32];
  stringstream ss;
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar1 = std::operator<<(local_198,"Caffe model error in layer \'");
  poVar1 = std::operator<<(poVar1,(string *)layerName);
  poVar1 = std::operator<<(poVar1,"\' of type \'");
  poVar1 = std::operator<<(poVar1,(string *)layerType);
  poVar1 = std::operator<<(poVar1,"\': ");
  poVar1 = std::operator<<(poVar1,(string *)errorDescription);
  poVar1 = std::operator<<(poVar1,". ");
  std::endl<char,std::char_traits<char>>(poVar1);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,asStack_1c8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void errorInCaffeProto(const std::string& errorDescription,
                                      const std::string& layerName,
                                      const std::string& layerType) {
        
        std::stringstream ss;
        ss << "Caffe model error in layer '" << layerName << "' of type '"<< layerType << "': "<< errorDescription <<". " << std::endl;
        throw std::runtime_error(ss.str());
    }